

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

void ssh_check_frozen(Ssh *ssh)

{
  _Bool _Var1;
  size_t sVar2;
  bool local_12;
  _Bool prev_frozen;
  Ssh *ssh_local;
  
  if (ssh->s != (Socket *)0x0) {
    _Var1 = ssh->socket_frozen;
    local_12 = true;
    if ((ssh->logically_frozen & 1U) == 0) {
      sVar2 = bufchain_size(&ssh->in_raw);
      local_12 = 0x8000 < sVar2;
    }
    ssh->socket_frozen = local_12;
    sk_set_frozen(ssh->s,(_Bool)(ssh->socket_frozen & 1));
    if ((((_Var1 & 1U) != 0) && ((ssh->socket_frozen & 1U) == 0)) &&
       (ssh->bpp != (BinaryPacketProtocol *)0x0)) {
      queue_idempotent_callback(&ssh->bpp->ic_in_raw);
    }
  }
  return;
}

Assistant:

void ssh_check_frozen(Ssh *ssh)
{
    if (!ssh->s)
        return;

    bool prev_frozen = ssh->socket_frozen;
    ssh->socket_frozen = (ssh->logically_frozen ||
                          bufchain_size(&ssh->in_raw) > SSH_MAX_BACKLOG);
    sk_set_frozen(ssh->s, ssh->socket_frozen);
    if (prev_frozen && !ssh->socket_frozen && ssh->bpp) {
        /*
         * If we've just unfrozen, process any SSH connection data
         * that was stashed in our queue while we were frozen.
         */
        queue_idempotent_callback(&ssh->bpp->ic_in_raw);
    }
}